

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void UA_Subscription_answerPublishRequestsNoSubscription(UA_Server *server,UA_NodeId *sessionToken)

{
  UA_PublishResponse *content;
  UA_PublishResponseEntry *pUVar1;
  UA_Session *pUVar2;
  UA_PublishResponseEntry *__ptr;
  undefined1 local_40 [8];
  timeval tv;
  
  pUVar2 = UA_SessionManager_getSession(&server->sessionManager,sessionToken);
  deleteMembers_noInit(sessionToken,UA_TYPES + 0x10);
  free(sessionToken);
  if (((pUVar2 != (UA_Session *)0x0) &&
      ((pUVar2->serverSubscriptions).lh_first == (UA_Subscription *)0x0)) &&
     (__ptr = (pUVar2->responseQueue).sqh_first, __ptr != (UA_PublishResponseEntry *)0x0)) {
    do {
      pUVar1 = (__ptr->listEntry).sqe_next;
      (pUVar2->responseQueue).sqh_first = pUVar1;
      if (pUVar1 == (UA_PublishResponseEntry *)0x0) {
        (pUVar2->responseQueue).sqh_last = &(pUVar2->responseQueue).sqh_first;
      }
      content = &__ptr->response;
      (__ptr->response).responseHeader.serviceResult = 0x80790000;
      gettimeofday((timeval *)local_40,(__timezone_ptr_t)0x0);
      (__ptr->response).responseHeader.timestamp =
           (long)local_40 * 10000000 + tv.tv_sec * 10 + 0x19db1ded53e8000;
      UA_SecureChannel_sendBinaryMessage(pUVar2->channel,__ptr->requestId,content,UA_TYPES + 0x4e);
      deleteMembers_noInit(content,UA_TYPES + 0x4e);
      memset(content,0,0xe8);
      free(__ptr);
      __ptr = (pUVar2->responseQueue).sqh_first;
    } while (__ptr != (UA_PublishResponseEntry *)0x0);
  }
  return;
}

Assistant:

void
UA_Subscription_answerPublishRequestsNoSubscription(UA_Server *server, UA_NodeId *sessionToken) {
    /* Get session */
    UA_Session *session = UA_SessionManager_getSession(&server->sessionManager, sessionToken);
    UA_NodeId_delete(sessionToken);

    /* No session or there are remaining subscriptions */
    if(!session || LIST_FIRST(&session->serverSubscriptions))
        return;

    /* Send a response for every queued request */
    UA_PublishResponseEntry *pre;
    while((pre = SIMPLEQ_FIRST(&session->responseQueue))) {
        SIMPLEQ_REMOVE_HEAD(&session->responseQueue, listEntry);
        UA_PublishResponse *response = &pre->response;
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOSUBSCRIPTION;
        response->responseHeader.timestamp = UA_DateTime_now();
        UA_SecureChannel_sendBinaryMessage(session->channel, pre->requestId, response,
                                           &UA_TYPES[UA_TYPES_PUBLISHRESPONSE]);
        UA_PublishResponse_deleteMembers(response);
        UA_free(pre);
    }
}